

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
CConnman::OpenNetworkConnection
          (CConnman *this,CAddress *addrConnect,bool fCountFailure,CSemaphoreGrant *grant_outbound,
          char *pszDest,ConnectionType conn_type,bool use_v2transport)

{
  pointer *pppCVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  iterator __position;
  CAddress addrConnect_00;
  bool bVar5;
  bool bVar6;
  Network NVar7;
  size_t sVar8;
  CNode *pCVar9;
  ConnectionType CVar10;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  CNode *pnode;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock81;
  undefined4 in_stack_ffffffffffffff58;
  CNode *in_stack_ffffffffffffff68;
  CNode *pCVar11;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_58 [16];
  char local_48 [24];
  
  CVar10 = (ConnectionType)CONCAT71(in_register_00000011,fCountFailure);
  local_48._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (conn_type == INBOUND) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0xb6a,
                  "void CConnman::OpenNetworkConnection(const CAddress &, bool, CSemaphoreGrant &&, const char *, ConnectionType, bool)"
                 );
  }
  bVar5 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
  if ((!bVar5) && (((this->fNetworkActive)._M_base._M_i & 1U) != 0)) {
    if (pszDest == (char *)0x0) {
      if (this->m_banman == (BanMan *)0x0) {
        bVar5 = false;
      }
      else {
        bVar5 = BanMan::IsDiscouraged(this->m_banman,(CNetAddr *)addrConnect);
        if (bVar5) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_48._16_8_) {
            IsLocal(&addrConnect->super_CService);
            return;
          }
          goto LAB_008c3b14;
        }
        bVar5 = BanMan::IsBanned(this->m_banman,(CNetAddr *)addrConnect);
      }
      bVar6 = IsLocal(&addrConnect->super_CService);
      if ((!bVar6 && bVar5 == false) &&
         (bVar5 = AlreadyConnectedToAddress(this,addrConnect), !bVar5)) goto LAB_008c38eb;
    }
    else {
      local_58._0_8_ = local_48;
      sVar8 = strlen(pszDest);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pszDest,pszDest + sVar8);
      pCVar9 = FindNode(this,(string *)local_58);
      if ((char *)local_58._0_8_ != local_48) {
        operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
      }
      if (pCVar9 == (CNode *)0x0) {
LAB_008c38eb:
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&stack0xffffffffffffff70,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addrConnect);
        uVar3 = (addrConnect->super_CService).super_CNetAddr.m_net;
        uVar4 = (addrConnect->super_CService).super_CNetAddr.m_scope_id;
        addrConnect_00.nServices._4_4_ = uVar4;
        addrConnect_00.nServices._0_4_ = uVar3;
        addrConnect_00.super_CService.super_CNetAddr.m_addr._union._4_4_ = CVar10;
        addrConnect_00.super_CService.super_CNetAddr.m_addr._union._0_4_ = in_stack_ffffffffffffff58
        ;
        addrConnect_00.super_CService.super_CNetAddr.m_addr._union._8_8_ = grant_outbound;
        addrConnect_00.super_CService.super_CNetAddr.m_addr._16_8_ = in_stack_ffffffffffffff68;
        addrConnect_00.super_CService.super_CNetAddr._24_8_ = in_stack_ffffffffffffff70;
        addrConnect_00.super_CService._32_8_ = in_stack_ffffffffffffff78;
        addrConnect_00.nTime.__d.__r._0_4_ = in_stack_ffffffffffffff80;
        addrConnect_00.nTime.__d.__r._4_4_ = in_stack_ffffffffffffff84;
        pCVar9 = ConnectNode(this,addrConnect_00,(char *)&stack0xffffffffffffff70,SUB81(pszDest,0),
                             CVar10 & 0xff,SUB41(conn_type,0));
        if (0x10 < in_stack_ffffffffffffff80) {
          free((void *)in_stack_ffffffffffffff70);
        }
        if (pCVar9 != (CNode *)0x0) {
          pCVar11 = pCVar9;
          if ((pCVar9->grantOutbound).fHaveGrant == true) {
            CSemaphore::post((pCVar9->grantOutbound).sem);
            (pCVar9->grantOutbound).fHaveGrant = false;
          }
          (pCVar9->grantOutbound).sem = grant_outbound->sem;
          (pCVar9->grantOutbound).fHaveGrant = grant_outbound->fHaveGrant;
          grant_outbound->fHaveGrant = false;
          grant_outbound->sem = (CSemaphore *)0x0;
          (**this->m_msgproc->_vptr_NetEventsInterface)(this->m_msgproc,pCVar9,this->nLocalServices)
          ;
          local_58._0_8_ = &this->m_nodes_mutex;
          local_58[8] = false;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)local_58);
          __position._M_current =
               (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            pCVar9 = pCVar11;
            std::vector<CNode*,std::allocator<CNode*>>::_M_realloc_insert<CNode*const&>
                      ((vector<CNode*,std::allocator<CNode*>> *)&this->m_nodes,__position,
                       (CNode **)&stack0xffffffffffffff68);
          }
          else {
            *__position._M_current = pCVar9;
            pppCVar1 = &(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
          if (ADDR_FETCH < pCVar9->m_conn_type) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.h"
                          ,0x319,"bool CNode::IsManualOrFullOutboundConn() const");
          }
          if ((0x39U >> (pCVar9->m_conn_type & 0x1f) & 1) == 0) {
            NVar7 = CNetAddr::GetNetwork((CNetAddr *)&pCVar9->addr);
            puVar2 = (this->m_network_conn_counts)._M_elems + NVar7;
            *puVar2 = *puVar2 + 1;
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)local_58);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48._16_8_) {
    return;
  }
LAB_008c3b14:
  __stack_chk_fail();
}

Assistant:

void CConnman::OpenNetworkConnection(const CAddress& addrConnect, bool fCountFailure, CSemaphoreGrant&& grant_outbound, const char *pszDest, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    //
    // Initiate outbound network connection
    //
    if (interruptNet) {
        return;
    }
    if (!fNetworkActive) {
        return;
    }
    if (!pszDest) {
        bool banned_or_discouraged = m_banman && (m_banman->IsDiscouraged(addrConnect) || m_banman->IsBanned(addrConnect));
        if (IsLocal(addrConnect) || banned_or_discouraged || AlreadyConnectedToAddress(addrConnect)) {
            return;
        }
    } else if (FindNode(std::string(pszDest)))
        return;

    CNode* pnode = ConnectNode(addrConnect, pszDest, fCountFailure, conn_type, use_v2transport);

    if (!pnode)
        return;
    pnode->grantOutbound = std::move(grant_outbound);

    m_msgproc->InitializeNode(*pnode, nLocalServices);
    {
        LOCK(m_nodes_mutex);
        m_nodes.push_back(pnode);

        // update connection count by network
        if (pnode->IsManualOrFullOutboundConn()) ++m_network_conn_counts[pnode->addr.GetNetwork()];
    }
}